

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDHashType ON_SubDHashTypeFromUnsigned(uint subd_hash_type_as_unsigned)

{
  if (subd_hash_type_as_unsigned < 4) {
    return (ON_SubDHashType)subd_hash_type_as_unsigned;
  }
  ON_SubDIncrementErrorCount();
  return Unset;
}

Assistant:

ON_SubDHashType ON_SubDHashTypeFromUnsigned(
  unsigned int subd_hash_type_as_unsigned
)
{
  switch (subd_hash_type_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDHashType::Unset);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDHashType::Topology);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDHashType::TopologyAndEdgeCreases);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDHashType::Geometry);
  }
  return ON_SUBD_RETURN_ERROR(ON_SubDHashType::Unset);
}